

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_correlation.c
# Opt level: O0

void WebRtcSpl_CrossCorrelationC
               (int32_t *cross_correlation,int16_t *seq1,int16_t *seq2,size_t dim_seq,
               size_t dim_cross_correlation,int right_shifts,int step_seq2)

{
  int local_4c;
  ulong uStack_48;
  int32_t corr;
  size_t j;
  size_t i;
  int right_shifts_local;
  size_t dim_cross_correlation_local;
  size_t dim_seq_local;
  int16_t *seq2_local;
  int16_t *seq1_local;
  int32_t *cross_correlation_local;
  
  dim_seq_local = (size_t)seq2;
  seq1_local = (int16_t *)cross_correlation;
  for (j = 0; j < dim_cross_correlation; j = j + 1) {
    local_4c = 0;
    for (uStack_48 = 0; uStack_48 < dim_seq; uStack_48 = uStack_48 + 1) {
      local_4c = ((int)seq1[uStack_48] * (int)*(short *)(dim_seq_local + uStack_48 * 2) >>
                 ((byte)right_shifts & 0x1f)) + local_4c;
    }
    dim_seq_local = dim_seq_local + (long)step_seq2 * 2;
    *(int *)seq1_local = local_4c;
    seq1_local = seq1_local + 2;
  }
  return;
}

Assistant:

void WebRtcSpl_CrossCorrelationC(int32_t* cross_correlation,
                                 const int16_t* seq1,
                                 const int16_t* seq2,
                                 size_t dim_seq,
                                 size_t dim_cross_correlation,
                                 int right_shifts,
                                 int step_seq2) {
  size_t i = 0, j = 0;

  for (i = 0; i < dim_cross_correlation; i++) {
    int32_t corr = 0;
    for (j = 0; j < dim_seq; j++)
      corr += (seq1[j] * seq2[j]) >> right_shifts;
    seq2 += step_seq2;
    *cross_correlation++ = corr;
  }
}